

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

BasicType __thiscall
wasm::Random::pick<wasm::Type::BasicType>
          (Random *this,FeatureOptions<wasm::Type::BasicType> *picker)

{
  BasicType BVar1;
  value_type *pvVar2;
  _Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_> local_30;
  
  items<wasm::Type::BasicType>
            ((vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_> *)&local_30,this
             ,picker);
  pvVar2 = pick<std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>>
                     (this,(vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_> *)
                           &local_30);
  BVar1 = *pvVar2;
  std::_Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>::~_Vector_base
            (&local_30);
  return BVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }